

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O1

bool ImPlot::ShowColormapSelector(char *label)

{
  uint uVar1;
  ImPlotContext *pIVar2;
  bool bVar3;
  ImVec2 in_RAX;
  bool bVar4;
  char *pcVar5;
  ulong uVar6;
  ImVec2 local_28;
  
  pIVar2 = GImPlot;
  uVar1 = (GImPlot->Style).Colormap;
  local_28 = in_RAX;
  if ((int)uVar1 < (GImPlot->ColormapData).Count) {
    if (((int)uVar1 < 0) || ((GImPlot->ColormapData).TextOffsets.Size <= (int)uVar1)) {
LAB_001bd958:
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                    ,0x68c,"const T &ImVector<int>::operator[](int) const [T = int]");
    }
    pcVar5 = (GImPlot->ColormapData).Text.Buf.Data + (GImPlot->ColormapData).TextOffsets.Data[uVar1]
    ;
  }
  else {
    pcVar5 = (char *)0x0;
  }
  bVar4 = false;
  bVar3 = ImGui::BeginCombo(label,pcVar5,0);
  if (bVar3) {
    if ((pIVar2->ColormapData).Count < 1) {
      bVar4 = false;
    }
    else {
      uVar6 = 0;
      bVar4 = false;
      do {
        if ((long)uVar6 < (long)(pIVar2->ColormapData).Count) {
          if ((long)(pIVar2->ColormapData).TextOffsets.Size <= (long)uVar6) goto LAB_001bd958;
          pcVar5 = (pIVar2->ColormapData).Text.Buf.Data +
                   (pIVar2->ColormapData).TextOffsets.Data[uVar6];
        }
        else {
          pcVar5 = (char *)0x0;
        }
        local_28.x = 0.0;
        local_28.y = 0.0;
        bVar3 = ImGui::Selectable(pcVar5,uVar6 == (uint)(pIVar2->Style).Colormap,0,&local_28);
        if (bVar3) {
          (pIVar2->Style).Colormap = (ImPlotColormap)uVar6;
          BustItemCache();
          bVar4 = true;
        }
        uVar6 = uVar6 + 1;
      } while ((long)uVar6 < (long)(pIVar2->ColormapData).Count);
    }
    ImGui::EndCombo();
  }
  return bVar4;
}

Assistant:

bool ShowColormapSelector(const char* label) {
    ImPlotContext& gp = *GImPlot;
    bool set = false;
    if (ImGui::BeginCombo(label, gp.ColormapData.GetName(gp.Style.Colormap))) {
        for (int i = 0; i < gp.ColormapData.Count; ++i) {
            const char* name = gp.ColormapData.GetName(i);
            if (ImGui::Selectable(name, gp.Style.Colormap == i)) {
                gp.Style.Colormap = i;
                ImPlot::BustItemCache();
                set = true;
            }
        }
        ImGui::EndCombo();
    }
    return set;
}